

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_instruction.cpp
# Opt level: O3

string * __thiscall
spvtools::val::(anonymous_namespace)::ToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,CapabilitySet *capabilities,
          AssemblyGrammar *grammar)

{
  char *__s;
  Capability operand;
  spv_result_t sVar1;
  ostream *poVar2;
  size_t sVar3;
  string *psVar4;
  size_t sVar5;
  CapabilitySet *__range2;
  iterator __begin2;
  spv_operand_desc desc;
  stringstream ss;
  iterator local_1e0;
  string *local_1c8;
  spv_operand_desc local_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1c8 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  EnumSet<spv::Capability>::cbegin(&local_1e0,(EnumSet<spv::Capability> *)this);
  sVar5 = *(long *)(this + 8) - *(long *)this >> 4;
  if (((local_1e0.set_ != (EnumSet<spv::Capability> *)this) || (local_1e0.bucketOffset_ != 0)) ||
     (local_1e0.bucketIndex_ != sVar5)) {
    do {
      operand = EnumSet<spv::Capability>::Iterator::operator*(&local_1e0);
      sVar1 = AssemblyGrammar::lookupOperand
                        ((AssemblyGrammar *)capabilities,SPV_OPERAND_TYPE_CAPABILITY,operand,
                         &local_1c0);
      if (sVar1 == SPV_SUCCESS) {
        __s = local_1c0->name;
        poVar2 = (ostream *)local_1a8;
        if (__s == (char *)0x0) {
          std::ios::clear((int)(ostream *)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
        }
        else {
          sVar3 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar3);
        }
      }
      else {
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      EnumSet<spv::Capability>::Iterator::operator++(&local_1e0);
    } while (((local_1e0.set_ != (EnumSet<spv::Capability> *)this) || (local_1e0.bucketOffset_ != 0)
             ) || (local_1e0.bucketIndex_ != sVar5));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  psVar4 = (string *)std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string ToString(const CapabilitySet& capabilities,
                     const AssemblyGrammar& grammar) {
  std::stringstream ss;
  for (auto capability : capabilities) {
    spv_operand_desc desc;
    if (SPV_SUCCESS == grammar.lookupOperand(SPV_OPERAND_TYPE_CAPABILITY,
                                             uint32_t(capability), &desc))
      ss << desc->name << " ";
    else
      ss << uint32_t(capability) << " ";
  }
  return ss.str();
}